

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

Var BailOutRecord::BailOutInlinedCommon
              (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,uint32 bailOutOffset,
              void *returnAddress,BailOutKind bailOutKind,ImplicitCallFlags savedImplicitCallFlags,
              Var branchValue)

{
  code *pcVar1;
  undefined8 bailOutRecord_00;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  ScriptFunction *function;
  undefined7 in_register_00000089;
  Var local_1e8;
  Var registerSaves [49];
  BailOutReturnValue bailOutReturnValue;
  BailOutRecord *currentBailOutRecord;
  ScriptFunction *innerMostInlinee;
  uint32 local_38;
  BailOutKind local_34;
  
  innerMostInlinee._4_4_ = (undefined4)CONCAT71(in_register_00000089,savedImplicitCallFlags);
  if (bailOutRecord->parent == (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    local_34 = bailOutKind;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x4a1,"(bailOutRecord->parent != nullptr)",
                       "bailOutRecord->parent != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    bailOutKind = local_34;
  }
  js_memcpy_s(&local_1e8,0x188,
              *(void **)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)layout + 8) + 8) + 0x490)
                                  + 0x3b8) + 0xa80),0x188);
  currentBailOutRecord = (BailOutRecord *)0x0;
  bailOutReturnValue._8_8_ = bailOutRecord;
  local_38 = bailOutOffset;
  BailOutInlinedHelper
            (layout,(BailOutRecord **)&bailOutReturnValue.returnValueRegSlot,bailOutOffset,
             returnAddress,bailOutKind,&local_1e8,(BailOutReturnValue *)(registerSaves + 0x30),
             (ScriptFunction **)&currentBailOutRecord,false,branchValue);
  SetHasBailedOutBit(bailOutRecord,
                     *(ScriptContext **)(*(long *)(*(long *)(*(long *)layout + 8) + 8) + 0x490));
  bailOutRecord_00 = bailOutReturnValue._8_8_;
  pvVar4 = BailOutCommonNoCodeGen
                     (layout,(BailOutRecord *)bailOutReturnValue._8_8_,
                      *(uint32 *)(bailOutReturnValue._8_8_ + 0x34),returnAddress,bailOutKind,
                      branchValue,&local_1e8,(BailOutReturnValue *)(registerSaves + 0x30),
                      (void *)0x0);
  function = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  ScheduleFunctionCodeGen
            (function,(ScriptFunction *)currentBailOutRecord,(BailOutRecord *)bailOutRecord_00,
             bailOutKind,local_38,innerMostInlinee._4_1_,returnAddress);
  return pvVar4;
}

Assistant:

Js::Var
BailOutRecord::BailOutInlinedCommon(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord, uint32 bailOutOffset,
    void * returnAddress, IR::BailOutKind bailOutKind, Js::ImplicitCallFlags savedImplicitCallFlags, Js::Var branchValue)
{
    Assert(bailOutRecord->parent != nullptr);

    // Need to capture the register save, one of the bailout might get into jitted code again and bailout again
    // overwriting the current register saves
    Js::Var registerSaves[BailOutRegisterSaveSlotCount];
    js_memcpy_s(registerSaves, sizeof(registerSaves), (Js::Var *)layout->functionObject->GetScriptContext()->GetThreadContext()->GetBailOutRegisterSaveSpace(),
        sizeof(registerSaves));
    BailOutRecord const * currentBailOutRecord = bailOutRecord;
    BailOutReturnValue bailOutReturnValue;
    Js::ScriptFunction * innerMostInlinee = nullptr;
    BailOutInlinedHelper(layout, currentBailOutRecord, bailOutOffset, returnAddress, bailOutKind, registerSaves, &bailOutReturnValue, &innerMostInlinee, false, branchValue);
    SetHasBailedOutBit(bailOutRecord, layout->functionObject->GetScriptContext());
    Js::Var result = BailOutCommonNoCodeGen(layout, currentBailOutRecord, currentBailOutRecord->bailOutOffset, returnAddress, bailOutKind, branchValue,
        registerSaves, &bailOutReturnValue);
    ScheduleFunctionCodeGen(Js::VarTo<Js::ScriptFunction>(layout->functionObject), innerMostInlinee, currentBailOutRecord, bailOutKind, bailOutOffset, savedImplicitCallFlags, returnAddress);
    return result;
}